

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

bool gflags::GetCommandLineFlagInfo(char *name,CommandLineFlagInfo *OUTPUT)

{
  Mutex *pMVar1;
  int iVar2;
  FlagRegistry *this;
  CommandLineFlag *this_00;
  bool bVar3;
  
  if (name == (char *)0x0) {
    bVar3 = false;
  }
  else {
    this = anon_unknown_2::FlagRegistry::GlobalRegistry();
    pMVar1 = &this->lock_;
    iVar2 = pMVar1->mutex_;
    pMVar1->mutex_ = pMVar1->mutex_ + -1;
    if (iVar2 != 0) {
      __assert_fail("--mutex_ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/gflags-src/src/mutex.h"
                    ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
    }
    this_00 = anon_unknown_2::FlagRegistry::FindFlagLocked(this,name);
    bVar3 = this_00 != (CommandLineFlag *)0x0;
    if (bVar3) {
      if (OUTPUT == (CommandLineFlagInfo *)0x0) {
        __assert_fail("OUTPUT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/gflags-src/src/gflags.cc"
                      ,0x658,
                      "bool gflags::GetCommandLineFlagInfo(const char *, CommandLineFlagInfo *)");
      }
      anon_unknown_2::CommandLineFlag::FillCommandLineFlagInfo(this_00,OUTPUT);
    }
    pMVar1 = &this->lock_;
    pMVar1->mutex_ = pMVar1->mutex_ + 1;
    if (pMVar1->mutex_ != 0) {
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/gflags-src/src/mutex.h"
                    ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
    }
  }
  return bVar3;
}

Assistant:

bool GetCommandLineFlagInfo(const char* name, CommandLineFlagInfo* OUTPUT) {
  if (NULL == name) return false;
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  CommandLineFlag* flag = registry->FindFlagLocked(name);
  if (flag == NULL) {
    return false;
  } else {
    assert(OUTPUT);
    flag->FillCommandLineFlagInfo(OUTPUT);
    return true;
  }
}